

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CustomModel.pb.cc
# Opt level: O3

void __thiscall CoreML::Specification::CustomModel::CustomModel(CustomModel *this)

{
  (this->super_MessageLite)._vptr_MessageLite = (_func_int **)&PTR__CustomModel_003c5240;
  (this->_internal_metadata_).
  super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
  .ptr_ = (void *)0x0;
  (this->parameters_).arena_ = (Arena *)0x0;
  *(undefined8 *)((long)&(this->parameters_).arena_ + 4) = 0;
  *(undefined8 *)((long)&(this->parameters_).map_.arena_ + 4) = 0;
  google::protobuf::
  Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::CustomModel_CustomModelParamValue>
  ::Init(&(this->parameters_).map_);
  (this->parameters_).map_.default_enum_value_ = 0;
  if (this != (CustomModel *)&_CustomModel_default_instance_) {
    protobuf_CustomModel_2eproto::InitDefaults();
  }
  (this->classname_).ptr_ =
       (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
  (this->description_).ptr_ =
       (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
  this->_cached_size_ = 0;
  return;
}

Assistant:

CustomModel::CustomModel()
  : ::google::protobuf::MessageLite(), _internal_metadata_(NULL) {
  if (GOOGLE_PREDICT_TRUE(this != internal_default_instance())) {
    protobuf_CustomModel_2eproto::InitDefaults();
  }
  SharedCtor();
  // @@protoc_insertion_point(constructor:CoreML.Specification.CustomModel)
}